

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parseOrigin(LEFReader *this)

{
  token_t tVar1;
  bool bVar2;
  double dVar3;
  string ynum;
  string xnum;
  allocator<char> local_89;
  string local_88;
  double local_68;
  double local_60;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  tVar1 = tokenize(this,&local_38);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_NUMBER) {
    tVar1 = tokenize(this,&local_58);
    this->m_curtok = tVar1;
    if (tVar1 == TOK_NUMBER) {
      tVar1 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar1;
      if (tVar1 == TOK_SEMICOL) {
        local_68 = std::__cxx11::stod(&local_38,(size_t *)0x0);
        local_60 = local_68;
        dVar3 = std::__cxx11::stod(&local_58,(size_t *)0x0);
        bVar2 = true;
        (*this->_vptr_LEFReader[4])(local_60,SUB84(dVar3,0),this);
        goto LAB_00126479;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Expected a semicolon\n",&local_89);
      error(this,&local_88);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Expected a number\n",&local_89);
      error(this,&local_88);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Expected a number\n",&local_89);
    error(this,&local_88);
  }
  std::__cxx11::string::~string((string *)&local_88);
  bVar2 = false;
LAB_00126479:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool LEFReader::parseOrigin()
{
    // ORIGIN <number> <number> ; 

    
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(xnum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(ynum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    double xnumd, ynumd;
    try
    {
        xnumd = std::stod(xnum);
        ynumd = std::stod(ynum);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onOrigin(xnumd, ynumd);

    //std::cout << "  ORIGIN " << xnum << " " << ynum << "\n";

    return true;
}